

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.cc
# Opt level: O0

void __thiscall trng::mrg4::seed(mrg4 *this,unsigned_long s)

{
  int64_t t;
  unsigned_long s_local;
  mrg4 *this_local;
  
  t = (long)s % 0x7fffffff;
  if (t < 0) {
    t = t + 0x7fffffff;
  }
  (this->S).r[0] = (int)t;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  (this->S).r[3] = 1;
  return;
}

Assistant:

void mrg4::seed(unsigned long s) {
    int64_t t(s);
    t %= modulus;
    if (t < 0)
      t += modulus;
    S.r[0] = static_cast<result_type>(t);
    S.r[1] = 1;
    S.r[2] = 1;
    S.r[3] = 1;
  }